

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
GraphPropagator::fullExpl(GraphPropagator *this,vector<Lit,_std::allocator<Lit>_> *ps)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BoolView *in_RSI;
  int i_1;
  int i;
  BoolView *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_1c;
  int local_14;
  
  for (local_14 = 0; iVar2 = nbNodes((GraphPropagator *)0x2a8572), local_14 < iVar2;
      local_14 = local_14 + 1) {
    getNodeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    bVar1 = BoolView::isFixed((BoolView *)0x2a8592);
    if (bVar1) {
      getNodeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      BoolView::getValLit(in_stack_ffffffffffffffb8);
      std::vector<Lit,_std::allocator<Lit>_>::push_back
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (value_type *)in_stack_ffffffffffffffb8);
    }
  }
  local_1c = 0;
  while (iVar2 = local_1c, iVar3 = nbEdges((GraphPropagator *)0x2a85f4), iVar2 < iVar3) {
    getEdgeVar((GraphPropagator *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    bVar1 = BoolView::isFixed((BoolView *)0x2a8614);
    if (bVar1) {
      in_stack_ffffffffffffffb8 = in_RSI;
      getEdgeVar((GraphPropagator *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_RSI >> 0x20));
      BoolView::getValLit(in_stack_ffffffffffffffb8);
      std::vector<Lit,_std::allocator<Lit>_>::push_back
                ((vector<Lit,_std::allocator<Lit>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (value_type *)in_stack_ffffffffffffffb8);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void GraphPropagator::fullExpl(std::vector<Lit>& ps) {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push_back(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push_back(getEdgeVar(i).getValLit());
		}
	}
}